

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::ZNames::ZNamesLoader::loadTimeZone
          (ZNamesLoader *this,UResourceBundle *zoneStrings,UnicodeString *tzID,UErrorCode *errorCode
          )

{
  char16_t cVar1;
  int32_t iVar2;
  char local_108 [8];
  char key [129];
  int32_t local_6c;
  undefined1 local_68 [4];
  int32_t i;
  UnicodeString uKey;
  UErrorCode *errorCode_local;
  UnicodeString *tzID_local;
  UResourceBundle *zoneStrings_local;
  ZNamesLoader *this_local;
  
  uKey.fUnion._48_8_ = errorCode;
  UnicodeString::UnicodeString((UnicodeString *)local_68,tzID);
  local_6c = 0;
  while( true ) {
    iVar2 = UnicodeString::length((UnicodeString *)local_68);
    if (iVar2 <= local_6c) break;
    cVar1 = UnicodeString::charAt((UnicodeString *)local_68,local_6c);
    if (cVar1 == L'/') {
      UnicodeString::setCharAt((UnicodeString *)local_68,local_6c,L':');
    }
    local_6c = local_6c + 1;
  }
  iVar2 = UnicodeString::length((UnicodeString *)local_68);
  UnicodeString::extract((UnicodeString *)local_68,0,iVar2,local_108,0x81,kInvariant);
  loadNames(this,zoneStrings,local_108,(UErrorCode *)uKey.fUnion._48_8_);
  UnicodeString::~UnicodeString((UnicodeString *)local_68);
  return;
}

Assistant:

void loadTimeZone(const UResourceBundle* zoneStrings, const UnicodeString& tzID, UErrorCode& errorCode) {
        // Replace "/" with ":".
        UnicodeString uKey(tzID);
        for (int32_t i = 0; i < uKey.length(); i++) {
            if (uKey.charAt(i) == (UChar)0x2F) {
                uKey.setCharAt(i, (UChar)0x3A);
            }
        }

        char key[ZID_KEY_MAX + 1];
        uKey.extract(0, uKey.length(), key, sizeof(key), US_INV);

        loadNames(zoneStrings, key, errorCode);
    }